

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::(anonymous_namespace)::
VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test::
~VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test
          (VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test *this)

{
  internal::anon_unknown_0::VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test::
  ~VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test
            ((VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitedMessageFieldsCountMatchesListFields) {
  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; }, FieldMask::kMessage);

  std::vector<const FieldDescriptor*> fields;
  reflection_->ListFields(*message_, &fields);
  int message_count = 0;
  for (auto field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ++message_count;
  }

  EXPECT_EQ(count, message_count);
}